

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Celero.cpp
# Opt level: O0

shared_ptr<celero::Benchmark> __thiscall
celero::RegisterBaseline
          (celero *this,char *groupName,char *benchmarkName,uint64_t samples,uint64_t iterations,
          uint64_t threads,shared_ptr<celero::Factory> *experimentFactory)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint64_t uVar1;
  char *pcVar2;
  bool bVar3;
  string *x;
  TestVector *this_01;
  element_type *peVar4;
  element_type *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<celero::Benchmark> sVar6;
  shared_ptr<celero::Experiment> local_f0;
  shared_ptr<celero::Factory> local_e0;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  shared_ptr<celero::Experiment> p;
  shared_ptr<celero::Benchmark> local_88 [2];
  allocator local_61;
  string local_60 [39];
  byte local_39;
  uint64_t local_38;
  uint64_t threads_local;
  uint64_t iterations_local;
  uint64_t samples_local;
  char *benchmarkName_local;
  char *groupName_local;
  shared_ptr<celero::Benchmark> *bm;
  
  local_38 = threads;
  threads_local = iterations;
  iterations_local = samples;
  samples_local = (uint64_t)benchmarkName;
  benchmarkName_local = groupName;
  groupName_local = (char *)this;
  if ((groupName == (char *)0x0) || (benchmarkName == (char *)0x0)) {
    std::shared_ptr<celero::Benchmark>::shared_ptr
              ((shared_ptr<celero::Benchmark> *)this,(nullptr_t)0x0);
    _Var5._M_pi = extraout_RDX_01;
  }
  else {
    local_39 = 0;
    x = (string *)TestVector::Instance();
    pcVar2 = benchmarkName_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar2,&local_61);
    TestVector::operator[]((TestVector *)this,x);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    bVar3 = std::operator==((shared_ptr<celero::Benchmark> *)this,(nullptr_t)0x0);
    if (bVar3) {
      std::make_shared<celero::Benchmark,char_const*&>((char **)local_88);
      std::shared_ptr<celero::Benchmark>::operator=((shared_ptr<celero::Benchmark> *)this,local_88);
      std::shared_ptr<celero::Benchmark>::~shared_ptr(local_88);
      this_01 = TestVector::Instance();
      this_00 = &p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<celero::Benchmark>::shared_ptr
                ((shared_ptr<celero::Benchmark> *)this_00,(shared_ptr<celero::Benchmark> *)this);
      TestVector::push_back(this_01,(shared_ptr<celero::Benchmark> *)this_00);
      std::shared_ptr<celero::Benchmark>::~shared_ptr
                ((shared_ptr<celero::Benchmark> *)
                 &p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::make_shared<celero::Experiment,std::shared_ptr<celero::Benchmark>&>
              ((shared_ptr<celero::Benchmark> *)local_a8);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    Experiment::setIsBaselineCase(peVar4,true);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    uVar1 = samples_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,(char *)uVar1,&local_c9);
    Experiment::setName(peVar4,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    Experiment::setSamples(peVar4,iterations_local);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    Experiment::setIterations(peVar4,threads_local);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    Experiment::setThreads(peVar4,local_38);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    std::shared_ptr<celero::Factory>::shared_ptr(&local_e0,experimentFactory);
    Experiment::setFactory(peVar4,&local_e0);
    std::shared_ptr<celero::Factory>::~shared_ptr(&local_e0);
    peVar4 = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    Experiment::setBaselineTarget(peVar4,1.0);
    this_02 = std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    std::shared_ptr<celero::Experiment>::shared_ptr
              (&local_f0,(shared_ptr<celero::Experiment> *)local_a8);
    Benchmark::setBaseline(this_02,&local_f0);
    std::shared_ptr<celero::Experiment>::~shared_ptr(&local_f0);
    local_39 = 1;
    std::shared_ptr<celero::Experiment>::~shared_ptr((shared_ptr<celero::Experiment> *)local_a8);
    _Var5._M_pi = extraout_RDX;
    if ((local_39 & 1) == 0) {
      std::shared_ptr<celero::Benchmark>::~shared_ptr((shared_ptr<celero::Benchmark> *)this);
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  sVar6.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Benchmark>)
         sVar6.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<celero::Benchmark> celero::RegisterBaseline(const char* groupName, const char* benchmarkName, const uint64_t samples,
															const uint64_t iterations, const uint64_t threads,
															std::shared_ptr<celero::Factory> experimentFactory)
{
	if(groupName != nullptr && benchmarkName != nullptr)
	{
		auto bm = celero::TestVector::Instance()[groupName];

		if(bm == nullptr)
		{
			bm = std::make_shared<Benchmark>(groupName);
			celero::TestVector::Instance().push_back(bm);
		}

		auto p = std::make_shared<Experiment>(bm);
		p->setIsBaselineCase(true);
		p->setName(benchmarkName);
		p->setSamples(samples);
		p->setIterations(iterations);
		p->setThreads(threads);
		p->setFactory(experimentFactory);
		p->setBaselineTarget(1.0);

		bm->setBaseline(p);

		return bm;
	}

	return nullptr;
}